

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

TCGArg do_constant_folding_cond2(TCGArg *p1,TCGArg *p2,TCGCond c)

{
  TCGArg arg;
  TCGArg arg_00;
  TCGArg arg_01;
  TCGArg arg_02;
  _Bool _Var1;
  tcg_temp_info *ptVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t a;
  tcg_target_ulong ahv;
  tcg_target_ulong alv;
  uint64_t b;
  tcg_target_ulong bhv;
  tcg_target_ulong blv;
  TCGArg bh;
  TCGArg bl;
  TCGArg ah;
  TCGArg al;
  TCGCond c_local;
  TCGArg *p2_local;
  TCGArg *p1_local;
  
  arg = *p1;
  arg_00 = p1[1];
  arg_01 = *p2;
  arg_02 = p2[1];
  _Var1 = arg_is_const(arg_01);
  if ((_Var1) && (_Var1 = arg_is_const(arg_02), _Var1)) {
    ptVar2 = arg_info(arg_01);
    uVar3 = ptVar2->val;
    ptVar2 = arg_info(arg_02);
    uVar3 = deposit64(uVar3,0x20,0x20,ptVar2->val);
    _Var1 = arg_is_const(arg);
    if ((_Var1) && (_Var1 = arg_is_const(arg_00), _Var1)) {
      ptVar2 = arg_info(arg);
      uVar4 = ptVar2->val;
      ptVar2 = arg_info(arg_00);
      uVar4 = deposit64(uVar4,0x20,0x20,ptVar2->val);
      _Var1 = do_constant_folding_cond_64(uVar4,uVar3,c);
      return (ulong)_Var1;
    }
    if (uVar3 == 0) {
      if (c == TCG_COND_LTU) {
        return 0;
      }
      if (c == TCG_COND_GEU) {
        p1_local = (TCGArg *)&DAT_00000001;
        return (TCGArg)p1_local;
      }
    }
  }
  _Var1 = args_are_copies(arg,arg_01);
  if ((_Var1) && (_Var1 = args_are_copies(arg_00,arg_02), _Var1)) {
    _Var1 = do_constant_folding_cond_eq(c);
    p1_local = (TCGArg *)(ulong)_Var1;
  }
  else {
    p1_local = (TCGArg *)&DAT_00000002;
  }
  return (TCGArg)p1_local;
}

Assistant:

static TCGArg do_constant_folding_cond2(TCGArg *p1, TCGArg *p2, TCGCond c)
{
    TCGArg al = p1[0], ah = p1[1];
    TCGArg bl = p2[0], bh = p2[1];

    if (arg_is_const(bl) && arg_is_const(bh)) {
        tcg_target_ulong blv = arg_info(bl)->val;
        tcg_target_ulong bhv = arg_info(bh)->val;
        uint64_t b = deposit64(blv, 32, 32, bhv);

        if (arg_is_const(al) && arg_is_const(ah)) {
            tcg_target_ulong alv = arg_info(al)->val;
            tcg_target_ulong ahv = arg_info(ah)->val;
            uint64_t a = deposit64(alv, 32, 32, ahv);
            return do_constant_folding_cond_64(a, b, c);
        }
        if (b == 0) {
            switch (c) {
            case TCG_COND_LTU:
                return 0;
            case TCG_COND_GEU:
                return 1;
            default:
                break;
            }
        }
    }
    if (args_are_copies(al, bl) && args_are_copies(ah, bh)) {
        return do_constant_folding_cond_eq(c);
    }
    return 2;
}